

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHash.h
# Opt level: O0

Hash_IntMan_t * Hash_IntManStart(int nSize)

{
  int nSize_00;
  Hash_IntMan_t *pHVar1;
  Vec_Int_t *pVVar2;
  Hash_IntMan_t *p;
  int nSize_local;
  
  pHVar1 = (Hash_IntMan_t *)calloc(1,0x18);
  nSize_00 = Abc_PrimeCudd(nSize + 100U);
  pVVar2 = Vec_IntStart(nSize_00);
  pHVar1->vTable = pVVar2;
  pVVar2 = Vec_IntAlloc((nSize + 100U) * 4);
  pHVar1->vObjs = pVVar2;
  Vec_IntFill(pHVar1->vObjs,4,0);
  pHVar1->nRefs = 1;
  return pHVar1;
}

Assistant:

static inline Hash_IntMan_t * Hash_IntManStart( int nSize )
{
    Hash_IntMan_t * p;  nSize += 100;
    p = ABC_CALLOC( Hash_IntMan_t, 1 );
    p->vTable = Vec_IntStart( Abc_PrimeCudd(nSize) );
    p->vObjs  = Vec_IntAlloc( 4*nSize );
    Vec_IntFill( p->vObjs, 4, 0 );
    p->nRefs  = 1;
    return p;
}